

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O0

XSParticle * __thiscall
xercesc_4_0::XSObjectFactory::createElementParticle
          (XSObjectFactory *this,ContentSpecNode *rootNode,XSModel *xsModel)

{
  int iVar1;
  int iVar2;
  XMLElementDecl *pXVar3;
  SchemaElementDecl *elemDecl;
  XSElementDeclaration *particleTerm;
  XSParticle *this_00;
  XSParticle *particle;
  int m;
  XSElementDeclaration *xsElemDecl;
  XSModel *xsModel_local;
  ContentSpecNode *rootNode_local;
  XSObjectFactory *this_local;
  
  pXVar3 = ContentSpecNode::getElementDecl(rootNode);
  if (pXVar3 != (XMLElementDecl *)0x0) {
    elemDecl = (SchemaElementDecl *)ContentSpecNode::getElementDecl(rootNode);
    particleTerm = addOrFind(this,elemDecl,xsModel,(XSComplexTypeDefinition *)0x0);
    if (particleTerm != (XSElementDeclaration *)0x0) {
      iVar1 = ContentSpecNode::getMaxOccurs(rootNode);
      this_00 = (XSParticle *)XMemory::operator_new(0x50,this->fMemoryManager);
      iVar2 = ContentSpecNode::getMinOccurs(rootNode);
      XSParticle::XSParticle
                (this_00,TERM_ELEMENT,xsModel,&particleTerm->super_XSObject,(long)iVar2,(long)iVar1,
                 (long)iVar1 == 0xffffffffffffffff,this->fMemoryManager);
      return this_00;
    }
  }
  return (XSParticle *)0x0;
}

Assistant:

XSParticle*
XSObjectFactory::createElementParticle(const ContentSpecNode* const rootNode,
                                       XSModel* const xsModel)
{
    if (rootNode->getElementDecl())
    {
        XSElementDeclaration* xsElemDecl = addOrFind(
            (SchemaElementDecl*) rootNode->getElementDecl(), xsModel);

        if (xsElemDecl)
        {
            int m = rootNode->getMaxOccurs();
            XSParticle* particle = new (fMemoryManager) XSParticle
            (
                XSParticle::TERM_ELEMENT
                , xsModel
                , xsElemDecl
                , (XMLSize_t)rootNode->getMinOccurs()
                , (XMLSize_t)m
                , m == -1
                , fMemoryManager
            );

            return particle;
        }
    }

    return 0;
}